

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O3

Known * __thiscall
Nonogram::get_board_vertical(Known *__return_storage_ptr__,Nonogram *this,uint x,Board *board)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  allocator_type local_82;
  allocator_type local_81;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)this->m_y,(bool *)&local_80,&local_82);
  local_82 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,(long)this->m_y,(bool *)&local_82,&local_81);
  uVar1 = this->m_y;
  if (0 < (int)uVar1) {
    lVar2 = *(long *)&(board->first).
                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[x].
                      super__Bvector_base<std::allocator<bool>_>._M_impl;
    lVar3 = *(long *)&(board->second).
                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[x].
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data;
    uVar8 = 0;
    lVar5 = CONCAT71(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                     local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_);
    do {
      uVar9 = 1L << ((byte)uVar8 & 0x3f);
      uVar4 = uVar8 >> 6;
      if ((*(ulong *)(lVar2 + uVar4 * 8) >> (uVar8 & 0x3f) & 1) == 0) {
        uVar10 = ~uVar9 & local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4];
      }
      else {
        uVar10 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar4] | uVar9;
      }
      uVar11 = (ulong)(uint)((int)uVar4 * 8);
      *(ulong *)((long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar11) =
           uVar10;
      if ((*(ulong *)(lVar3 + uVar11) & uVar9) == 0) {
        uVar9 = ~uVar9 & *(ulong *)(lVar5 + uVar4 * 8);
      }
      else {
        uVar9 = uVar9 | *(ulong *)(lVar5 + uVar4 * 8);
      }
      *(ulong *)(lVar5 + uVar4 * 8) = uVar9;
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar1 != uVar7);
  }
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<bool,_std::allocator<bool>_>_&,_true>
            (__return_storage_ptr__,&local_58,&local_80);
  pvVar6 = (void *)CONCAT71(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                            local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Known Nonogram::get_board_vertical(unsigned int x, const Board &board) const {
    vector<bool> set(m_y), value(m_y);

    for (int i = 0; i < m_y; i++) {
        set[i] = board.first[x][i];
        value[i] = board.second[x][i];
    }

    return {set, value};
}